

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O2

void polygon_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  Am_Slot_Key AVar4;
  Am_Drawonable *pAVar5;
  Am_Value *pAVar6;
  Am_Wrapper *value;
  ostream *poVar7;
  char *pcVar8;
  int iVar9;
  bool bVar10;
  float fVar11;
  float fVar12;
  float scale_x;
  float fVar13;
  float scale_y;
  float fVar14;
  float fVar15;
  int height;
  int top;
  int left;
  Am_Object self;
  int width;
  float local_b4;
  Am_Drawonable *local_b0;
  Am_Style ls;
  float local_9c;
  int local_8c;
  int pl_top;
  int pl_left;
  Am_Style local_80;
  Am_Point_List pl;
  int curr_width;
  int curr_top;
  int curr_left;
  int pl_height;
  int pl_width;
  Am_Point_List new_pl;
  Am_Slot slot;
  Am_Object local_38;
  
  Am_Web_Events::End(events);
  slot = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&new_pl);
  Am_Object::Am_Object(&self,(Am_Object *)&new_pl);
  Am_Object::~Am_Object((Am_Object *)&new_pl);
  Am_Object::Am_Object(&local_38,&self);
  pAVar5 = Get_a_drawonable(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar6 = Am_Object::Get(&self,0xb2,0);
  Am_Point_List::Am_Point_List(&pl,pAVar6);
  pAVar6 = Am_Object::Get(&self,0x6b,0);
  Am_Style::Am_Style(&ls,pAVar6);
  pAVar6 = Am_Object::Get(&self,100,0);
  left = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&self,0x65,0);
  top = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = Am_Object::Get(&self,0x66,0);
  width = Am_Value::operator_cast_to_int(pAVar6);
  local_b0 = pAVar5;
  pAVar6 = Am_Object::Get(&self,0x67,0);
  height = Am_Value::operator_cast_to_int(pAVar6);
  Am_Web_Events::End(events);
  while (bVar1 = Am_Web_Events::First(events), !bVar1) {
    slot = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&slot);
    switch(AVar4) {
    case 100:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      left = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x65:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      top = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x66:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      width = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x67:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      height = Am_Value::operator_cast_to_int(pAVar6);
      break;
    case 0x68:
      break;
    case 0x69:
    case 0x6a:
switchD_001ef396_caseD_69:
      poVar7 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
      poVar7 = std::operator<<(poVar7,"** Bug: unexpected slot in polygon_web_validate: ");
      pcVar8 = Am_Get_Slot_Name(AVar4);
      poVar7 = std::operator<<(poVar7,pcVar8);
      std::endl<char,std::char_traits<char>>(poVar7);
      Am_Error();
    case 0x6b:
      pAVar6 = Am_Web_Events::Get_Prev_Value(events);
      Am_Style::operator=(&ls,pAVar6);
      break;
    default:
      if (AVar4 != 0x7d2) {
        if (AVar4 != 0xb2) goto switchD_001ef396_caseD_69;
        bVar2 = Am_Point_List::Valid(&pl);
        if (bVar2 && local_b0 != (Am_Drawonable *)0x0) {
          (*local_b0->_vptr_Am_Drawonable[0x1c])(local_b0,&pl,&ls,&left,&top,&width,&height);
        }
        goto LAB_001ef474;
      }
    }
    Am_Web_Events::Prev(events);
  }
LAB_001ef474:
  Am_Web_Events::Next(events);
  bVar1 = !bVar1;
  bVar10 = false;
  bVar2 = false;
  do {
    bVar3 = Am_Web_Events::Last(events);
    if (bVar3) {
      if ((bVar2) && (bVar2 = Am_Point_List::Valid(&pl), bVar2 && local_b0 != (Am_Drawonable *)0x0))
      {
        Am_Style::Am_Style(&local_80,&ls);
        (*local_b0->_vptr_Am_Drawonable[0x1c])
                  (local_b0,&pl,&local_80,&pl_left,&pl_top,&pl_width,&pl_height);
        iVar9 = height;
        if ((left != pl_left) ||
           ((width != pl_width || top != pl_top || (pl_width = width, height != pl_height)))) {
          local_b4 = scale_factor(width,pl_width);
          fVar11 = scale_factor(iVar9,pl_height);
          Am_Point_List::Am_Point_List(&new_pl,&pl);
          fVar12 = local_b4 * 0.5;
          local_b4 = local_b4 + local_b4;
          scale_x = (fVar12 + local_b4) * 0.5;
          scale_y = (fVar11 * 0.5 + fVar11 + fVar11) * 0.5;
          Am_Point_List::Scale(&new_pl,scale_x,scale_y,pl_left,pl_top,true);
          (*local_b0->_vptr_Am_Drawonable[0x1c])
                    (local_b0,&new_pl,&local_80,&curr_left,&curr_top,&curr_width,&local_8c);
          fVar15 = fVar11 + fVar11;
          fVar14 = local_b4;
          local_9c = fVar11 * 0.5;
          for (iVar9 = 0x10; ((curr_width != width || (local_8c != height)) && (0 < iVar9));
              iVar9 = iVar9 + -1) {
            fVar11 = scale_x;
            if ((curr_width < width) || (fVar11 = fVar12, fVar13 = scale_x, curr_width <= width)) {
              fVar12 = fVar11;
              fVar13 = fVar14;
            }
            scale_x = (fVar12 + fVar13) * 0.5;
            fVar11 = scale_y;
            fVar14 = fVar15;
            if ((height <= local_8c) && (fVar11 = local_9c, fVar14 = scale_y, local_8c <= height)) {
              fVar14 = fVar15;
            }
            local_b4 = (fVar11 + fVar14) * 0.5;
            Am_Point_List::operator=(&new_pl,&pl);
            Am_Point_List::Scale(&new_pl,scale_x,local_b4,pl_left,pl_top,true);
            (*local_b0->_vptr_Am_Drawonable[0x1c])
                      (local_b0,&new_pl,&local_80,&curr_left,&curr_top,&curr_width,&local_8c);
            scale_y = local_b4;
            fVar15 = fVar14;
            fVar14 = fVar13;
            local_9c = fVar11;
          }
          Am_Point_List::Translate(&new_pl,left - curr_left,top - curr_top,true);
          Am_Point_List::operator=(&pl,&new_pl);
          Am_Point_List::~Am_Point_List(&new_pl);
        }
        Am_Style::~Am_Style(&local_80);
      }
      if (bVar10) {
        value = Am_Point_List::operator_cast_to_Am_Wrapper_(&pl);
        Am_Object::Set(&self,0xb2,value,0);
      }
      if (bVar1) {
        Am_Object::Set(&self,100,left,0);
        Am_Object::Set(&self,0x65,top,0);
        Am_Object::Set(&self,0x66,width,0);
        Am_Object::Set(&self,0x67,height,0);
      }
      Am_Style::~Am_Style(&ls);
      Am_Point_List::~Am_Point_List(&pl);
      Am_Object::~Am_Object(&self);
      return;
    }
    slot = Am_Web_Events::Get(events);
    AVar4 = Am_Slot::Get_Key(&slot);
    switch(AVar4) {
    case 100:
      pAVar6 = Am_Object::Get(&self,100,4);
      iVar9 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Point_List::Translate(&pl,iVar9 - left,0,true);
      left = iVar9;
      goto LAB_001ef56f;
    case 0x65:
      pAVar6 = Am_Object::Get(&self,0x65,4);
      iVar9 = Am_Value::operator_cast_to_int(pAVar6);
      Am_Point_List::Translate(&pl,0,iVar9 - top,true);
      top = iVar9;
LAB_001ef56f:
      bVar10 = true;
      break;
    case 0x66:
      pAVar6 = Am_Object::Get(&self,0x66,4);
      iVar9 = Am_Value::operator_cast_to_int(pAVar6);
      fVar12 = scale_factor(iVar9,width);
      Am_Point_List::Scale(&pl,fVar12,1.0,left,top,true);
      width = iVar9;
      goto LAB_001ef674;
    case 0x67:
      pAVar6 = Am_Object::Get(&self,0x67,4);
      iVar9 = Am_Value::operator_cast_to_int(pAVar6);
      fVar12 = scale_factor(iVar9,height);
      Am_Point_List::Scale(&pl,1.0,fVar12,left,top,true);
      height = iVar9;
LAB_001ef674:
      bVar10 = true;
      bVar2 = true;
      break;
    case 0x68:
switchD_001ef4d9_caseD_68:
      bVar3 = Am_Point_List::Valid(&pl);
      bVar1 = true;
      if (bVar3 && local_b0 != (Am_Drawonable *)0x0) {
LAB_001ef5b2:
        bVar1 = true;
        (*local_b0->_vptr_Am_Drawonable[0x1c])(local_b0,&pl,&ls,&left,&top,&width,&height);
      }
      break;
    case 0x69:
    case 0x6a:
      break;
    case 0x6b:
      pAVar6 = Am_Object::Get(&self,0x6b,4);
      Am_Style::operator=(&ls,pAVar6);
      bVar3 = Am_Point_List::Valid(&pl);
      bVar1 = true;
      if (local_b0 != (Am_Drawonable *)0x0 && bVar3) goto LAB_001ef5b2;
      break;
    default:
      if (AVar4 == 0x7d2) goto switchD_001ef4d9_caseD_68;
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

static void
polygon_web_validate(Am_Web_Events &events)
{
  events.End();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  Am_Drawonable *draw = Get_a_drawonable(self);
  Am_Point_List pl = self.Get(Am_POINT_LIST);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool rescaled = false;
  bool pl_changed = false;
  bool bbox_changed = false;

  // compute ORIGINAL values of left/top/width/height by working
  // backwards through the change events
  events.End();
  while (!events.First()) {
    slot = events.Get();

    Am_Slot_Key key = slot.Get_Key();
    if (key == Am_POINT_LIST) {
      // these changes supersedes all earlier changes, so find its
      // bounding box and stop looking backwards
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
    } else
      switch (key) {
      case Am_WINDOW:
      case Am_DRAWONABLE:
        break;
      case Am_LINE_STYLE:
        ls = events.Get_Prev_Value();
        break;
      case Am_LEFT:
        left = events.Get_Prev_Value();
        break;
      case Am_TOP:
        top = events.Get_Prev_Value();
        break;
      case Am_WIDTH:
        width = events.Get_Prev_Value();
        break;
      case Am_HEIGHT:
        height = events.Get_Prev_Value();
        break;

      default:
        Am_ERROR("** Bug: unexpected slot in polygon_web_validate: "
                 << Am_Get_Slot_Name(key));
      }

    events.Prev();
  }

  // now go forwards, looking at the CHANGES made to each slot
  events.Next();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
#if 0
    case Am_POINT_LIST:
      pl = self.Get (Am_POINT_LIST);
      if (pl.Valid() && draw)
	draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
#endif

    case Am_WINDOW:
    case Am_DRAWONABLE:
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LINE_STYLE:
      // recompute bounding box with new line style
      ls = self.Get(Am_LINE_STYLE, Am_NO_DEPENDENCY);
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LEFT: {
      int new_left = self.Get(Am_LEFT, Am_NO_DEPENDENCY);
      pl.Translate(new_left - left, 0);
      left = new_left;
      pl_changed = true;
      break;
    }

    case Am_TOP: {
      int new_top = self.Get(Am_TOP, Am_NO_DEPENDENCY);
      pl.Translate(0, new_top - top);
      top = new_top;
      pl_changed = true;
      break;
    }

    case Am_WIDTH: {
      int new_width = self.Get(Am_WIDTH, Am_NO_DEPENDENCY);
      pl.Scale(scale_factor(new_width, width), 1.0f, left, top);
      width = new_width;
      rescaled = true;
      pl_changed = true;
      break;
    }

    case Am_HEIGHT: {
      int new_height = self.Get(Am_HEIGHT, Am_NO_DEPENDENCY);
      pl.Scale(1.0f, scale_factor(new_height, height), left, top);
      height = new_height;
      rescaled = true;
      pl_changed = true;
      break;
    }
    }
    events.Next();
  }

  if (rescaled && pl.Valid() && draw)
    // check that scaling produced a polygon with the correct bounding box.
    // how could this fail?  several possibilities: line thickness
    // doesn't scale;  and mitered joins may grow or shrink
    // orthogonally to the scaling.

    general_polygon_validate(pl, left, top, width, height, ls, draw);

#ifdef TEST_POLYGON_CONSTRAINT
  // debugging check that bounding box is correct
  if (pl.Valid() && draw) {
    int curr_left, curr_top, curr_width, curr_height;
    draw->Get_Polygon_Bounding_Box(pl, ls, curr_left, curr_top, curr_width,
                                   curr_height);
    if (!(left == curr_left && top == curr_top && width == curr_width &&
          height == curr_height))
      std::cout << "** polygon_web_validate: bounding box (" << left << ","
                << top << "," << width << "," << height << ")"
                << " inconsistent with point list (" << curr_left << ","
                << curr_top << "," << curr_width << "," << curr_height << ")"
                << std::endl;
  }
#endif

  if (pl_changed)
    self.Set(Am_POINT_LIST, pl);

  if (bbox_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_TOP, top);
    self.Set(Am_WIDTH, width);
    self.Set(Am_HEIGHT, height);
  }
}